

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O1

bool vkt::anon_unknown_0::verifyStencilAttachment
               (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                *reference,ConstPixelBufferAccess *result,PixelBufferAccess *errorImage)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  bool bVar5;
  int x;
  Vec4 *color;
  int y;
  bool bVar6;
  Maybe<bool> maybeValue;
  Vec4 green;
  Vec4 red;
  byte local_58 [8];
  Vec4 local_50;
  Vec4 local_40;
  
  local_40.m_data[0] = 1.0;
  local_40.m_data[1] = 0.0;
  local_40.m_data[2] = 0.0;
  local_40.m_data[3] = 1.0;
  local_50.m_data[0] = 0.0;
  local_50.m_data[1] = 1.0;
  local_50.m_data[2] = 0.0;
  local_50.m_data[3] = 1.0;
  if ((result->m_size).m_data[1] < 1) {
    bVar6 = true;
  }
  else {
    y = 0;
    bVar6 = true;
    do {
      if (0 < (result->m_size).m_data[0]) {
        x = 0;
        bVar5 = bVar6;
        do {
          iVar2 = tcu::ConstPixelBufferAccess::getPixStencil(result,x,y,0);
          uVar1 = (reference->
                  super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                  )._M_impl.super__Vector_impl_data._M_start[(result->m_size).m_data[0] * y + x].
                  m_status;
          if ((uVar1 & 4) == 0) {
            pbVar4 = (byte *)0x0;
          }
          else {
            local_58[0] = (byte)uVar1 >> 3 & 1;
            pbVar4 = local_58;
          }
          if (pbVar4 == (byte *)0x0) {
LAB_003d37c3:
            color = &local_50;
            bVar6 = bVar5;
          }
          else {
            iVar3 = 0;
            if (*pbVar4 != 0) {
              iVar3 = 0xff;
            }
            color = &local_40;
            bVar6 = false;
            if (iVar2 == iVar3) goto LAB_003d37c3;
          }
          tcu::PixelBufferAccess::setPixel(errorImage,color,x,y,0);
          x = x + 1;
          bVar5 = bVar6;
        } while (x < (result->m_size).m_data[0]);
      }
      y = y + 1;
    } while (y < (result->m_size).m_data[1]);
  }
  return bVar6;
}

Assistant:

bool verifyStencilAttachment (const vector<PixelValue>&		reference,
							  const ConstPixelBufferAccess&	result,
							  const PixelBufferAccess&		errorImage)
{
	const Vec4	red		(1.0f, 0.0f, 0.0f, 1.0f);
	const Vec4	green	(0.0f, 1.0f, 0.0f, 1.0f);
	bool		ok		= true;

	DE_ASSERT(result.getWidth() * result.getHeight() == (int)reference.size());
	DE_ASSERT(result.getWidth() == errorImage.getWidth());
	DE_ASSERT(result.getHeight() == errorImage.getHeight());

	for (int y = 0; y < result.getHeight(); y++)
	for (int x = 0; x < result.getWidth(); x++)
	{
		bool pixelOk = true;

		const deUint32		resultStencil	= result.getPixStencil(x, y);
		const PixelValue&	referenceValue	= reference[x + y * result.getWidth()];
		const Maybe<bool>	maybeValue		= referenceValue.getValue(1);

		if (maybeValue)
		{
			const bool value = *maybeValue;

			if ((value && (resultStencil != 0xFFu))
				|| (!value && resultStencil != 0x0u))
				pixelOk = false;
		}

		if (!pixelOk)
		{
			errorImage.setPixel(red, x, y);
			ok = false;
		}
		else
			errorImage.setPixel(green, x, y);
	}

	return ok;
}